

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O1

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint _h;
  uint uVar12;
  ulong uVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  ulong uVar18;
  int _w;
  ulong local_80;
  ulong local_78;
  undefined4 *local_70;
  undefined4 *local_60;
  
  uVar1 = bottom_blob->c;
  iVar10 = this->stride;
  uVar9 = (long)bottom_blob->w / (long)iVar10;
  _h = bottom_blob->h / iVar10;
  _w = (int)uVar9;
  Mat::create(top_blob,_w,_h,uVar1 * iVar10 * iVar10,bottom_blob->elemsize,opt->blob_allocator);
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      iVar10 = bottom_blob->w;
      local_60 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      uVar2 = this->stride;
      sVar5 = bottom_blob->elemsize;
      local_80 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar6 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          local_70 = local_60;
          local_78 = 0;
          do {
            if (0 < (int)uVar2) {
              iVar3 = this->stride;
              uVar18 = 0;
              puVar17 = local_70;
              do {
                if (0 < (int)_h) {
                  puVar15 = (undefined4 *)
                            ((uVar18 + (long)(int)(((int)local_80 * uVar2 + (int)local_78) * uVar2))
                             * sVar7 * sVar8 + (long)pvVar6);
                  uVar11 = 0;
                  puVar14 = puVar17;
                  do {
                    uVar13 = uVar9 & 0xffffffff;
                    puVar16 = puVar14;
                    if (0 < _w) {
                      do {
                        *puVar15 = *puVar16;
                        puVar15 = puVar15 + 1;
                        puVar16 = puVar16 + iVar3;
                        uVar12 = (int)uVar13 - 1;
                        uVar13 = (ulong)uVar12;
                      } while (uVar12 != 0);
                    }
                    uVar11 = uVar11 + 1;
                    puVar14 = (undefined4 *)((long)puVar14 + (long)iVar10 * 4 * (long)iVar3);
                  } while (uVar11 != _h);
                }
                uVar18 = uVar18 + 1;
                puVar17 = puVar17 + 1;
              } while (uVar18 != uVar2);
            }
            local_78 = local_78 + 1;
            local_70 = local_70 + iVar10;
          } while (local_78 != uVar2);
        }
        local_80 = local_80 + 1;
        local_60 = (undefined4 *)((long)local_60 + sVar4 * sVar5);
      } while (local_80 != uVar1);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}